

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O3

bool __thiscall
Indexing::ClauseCodeTree::ClauseMatcher::existsCompatibleMatch
          (ClauseMatcher *this,ILStruct *si,MatchInfo *sq,ILStruct *targets)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  MatchInfo **ppMVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = (ulong)targets->matchCnt;
  if (uVar6 == 0) {
    bVar3 = false;
  }
  else {
    ppMVar4 = CodeTree::ILStruct::getMatch(targets,0);
    bVar2 = compatible(this,si,sq,targets,*ppMVar4);
    bVar3 = true;
    if (!bVar2) {
      uVar1 = 1;
      do {
        uVar5 = uVar1;
        if (uVar6 == uVar5) break;
        ppMVar4 = CodeTree::ILStruct::getMatch(targets,(uint)uVar5);
        bVar3 = compatible(this,si,sq,targets,*ppMVar4);
        uVar1 = uVar5 + 1;
      } while (!bVar3);
      bVar3 = uVar5 < uVar6;
    }
  }
  return bVar3;
}

Assistant:

bool ClauseCodeTree::ClauseMatcher::existsCompatibleMatch(ILStruct* si, MatchInfo* sq, ILStruct* targets)
{
  size_t tcnt=targets->matchCnt;
  for(size_t i=0;i<tcnt;i++) {
    if(compatible(si,sq,targets,targets->getMatch(i))) {
      return true;
    }
  }
  return false;
}